

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.h
# Opt level: O2

void __thiscall minihttp::Request::Request(Request *this,Request *param_1)

{
  void *pvVar1;
  undefined4 uVar2;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  std::__cxx11::string::string((string *)&this->host,(string *)&param_1->host);
  std::__cxx11::string::string((string *)&this->header,(string *)&param_1->header);
  std::__cxx11::string::string((string *)&this->resource,(string *)&param_1->resource);
  std::__cxx11::string::string((string *)&this->extraGetHeaders,(string *)&param_1->extraGetHeaders)
  ;
  this->useSSL = param_1->useSSL;
  uVar2 = *(undefined4 *)&param_1->field_0xa4;
  pvVar1 = param_1->user;
  this->port = param_1->port;
  *(undefined4 *)&this->field_0xa4 = uVar2;
  this->user = pvVar1;
  std::__cxx11::string::string((string *)&this->post,(string *)&param_1->post);
  return;
}

Assistant:

Request() : port(80), user(NULL) {}